

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ROR_ZP_X(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte data;
  
  this->cycles = 6;
  uVar1 = GetByte(this);
  bVar2 = uVar1 + this->X;
  this->cycles = this->cycles - 1;
  bVar3 = ReadByte(this,(ushort)bVar2);
  bVar4 = (this->field_6).ps << 7;
  this->cycles = this->cycles - 1;
  data = bVar4 | bVar3 >> 1;
  (this->field_6).ps = bVar4 | (data == 0) * '\x02' | (this->field_6).ps & 0x7c | bVar3 & 1;
  WriteByte(this,(ushort)bVar2,data);
  return;
}

Assistant:

void CPU::ROR_ZP_X()
{
    cycles = 6;
    uint8_t addr = GetByte() + X;
    cycles--;
    uint8_t data = ReadByte(addr);
    uint8_t cr = C ? 0b10000000 : 0;
    C = (data & 0b00000001) > 0;
    data >>= 1;
    data |= cr;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}